

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O3

int check16u(aint val)

{
  char buffer [64];
  char acStack_58 [72];
  
  if ((uint)val >= 0x10000) {
    snprintf(acStack_58,0x40,"value 0x%X is truncated to 16bit value: 0x%04X",(ulong)(uint)val,
             (ulong)(ushort)val);
    Warning(acStack_58,(char *)0x0,W_PASS3);
  }
  return (uint)((uint)val < 0x10000);
}

Assistant:

int check16u(aint val) {
	if (val < 0 || val > 65535) {
		char buffer[64];
		SPRINTF2(buffer, 64, "value 0x%X is truncated to 16bit value: 0x%04X", val, val&0xFFFF);
		Warning(buffer);
		return 0;
	}
	return 1;
}